

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_att.cc
# Opt level: O0

X509_ATTRIBUTE *
X509_ATTRIBUTE_create_by_NID(X509_ATTRIBUTE **attr,int nid,int atrtype,void *data,int len)

{
  ASN1_OBJECT *obj_00;
  ASN1_OBJECT *obj;
  int len_local;
  void *data_local;
  int attrtype_local;
  int nid_local;
  X509_ATTRIBUTE **attr_local;
  
  obj_00 = OBJ_nid2obj(nid);
  if (obj_00 == (ASN1_OBJECT *)0x0) {
    ERR_put_error(0xb,0,0x81,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_att.cc"
                  ,0x1f);
    attr_local = (X509_ATTRIBUTE **)0x0;
  }
  else {
    attr_local = (X509_ATTRIBUTE **)X509_ATTRIBUTE_create_by_OBJ(attr,obj_00,atrtype,data,len);
  }
  return (X509_ATTRIBUTE *)attr_local;
}

Assistant:

X509_ATTRIBUTE *X509_ATTRIBUTE_create_by_NID(X509_ATTRIBUTE **attr, int nid,
                                             int attrtype, const void *data,
                                             int len) {
  const ASN1_OBJECT *obj;

  obj = OBJ_nid2obj(nid);
  if (obj == NULL) {
    OPENSSL_PUT_ERROR(X509, X509_R_UNKNOWN_NID);
    return NULL;
  }
  return X509_ATTRIBUTE_create_by_OBJ(attr, obj, attrtype, data, len);
}